

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_Const_Test::Body
          (iu_PeepClassTest_x_iutest_x_Const_Test *this)

{
  peep_member_object_impl<test::prod_test::ProdClass,_const_int,_true> *in_R9;
  type prod_class_c;
  AssertionResult iutest_ar;
  undefined1 *local_1f0;
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_1f0 = s_prod;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  iutest::internal::
  CmpHelperEQ<int,iutest::detail::peep::Peep<test::prod_test::ProdClass,test::prod_test::iu_peep_tag_m_c<test::prod_test::ProdClass>>::peep_member_object_impl<test::prod_test::ProdClass,int_const,true>>
            (&local_1e8,(internal *)"42","prod_class_c",(char *)&local_190,(int *)&local_1f0,in_R9);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,200,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

IUTEST(PeepTest, StaticProtectedPeep)
{
    IUTEST_PEEP_STATIC_GET(ProtectedProdClass, m_y) = 4;
    IUTEST_EXPECT_EQ(4, ProtectedProdClass::GetY());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_STATIC_GET(ProtectedProdClass, m_y));
}